

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_row_layout(nk_context *ctx,nk_layout_format fmt,float height,int cols,int width)

{
  long lVar1;
  int in_ECX;
  int in_ESI;
  long in_RDI;
  nk_window *win;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    lVar1 = *(long *)(in_RDI + 0x40d8);
    nk_panel_layout(ctx,(nk_window *)CONCAT44(fmt,height),(float)cols,width);
    if (in_ESI == 0) {
      *(undefined4 *)(*(long *)(lVar1 + 0xa8) + 0x70) = 0;
    }
    else {
      *(undefined4 *)(*(long *)(lVar1 + 0xa8) + 0x70) = 4;
    }
    *(undefined8 *)(*(long *)(lVar1 + 0xa8) + 0x88) = 0;
    *(undefined4 *)(*(long *)(lVar1 + 0xa8) + 0x9c) = 0;
    *(undefined4 *)(*(long *)(lVar1 + 0xa8) + 0x98) = 0;
    *(float *)(*(long *)(lVar1 + 0xa8) + 0x90) = (float)in_ECX;
  }
  return;
}

Assistant:

NK_LIB void
nk_row_layout(struct nk_context *ctx, enum nk_layout_format fmt,
float height, int cols, int width)
{
/* update the current row and set the current row layout */
struct nk_window *win;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
nk_panel_layout(ctx, win, height, cols);
if (fmt == NK_DYNAMIC)
win->layout->row.type = NK_LAYOUT_DYNAMIC_FIXED;
else win->layout->row.type = NK_LAYOUT_STATIC_FIXED;

win->layout->row.ratio = 0;
win->layout->row.filled = 0;
win->layout->row.item_offset = 0;
win->layout->row.item_width = (float)width;
}